

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::EnumDescriptorProto::ByteSizeLong(EnumDescriptorProto *this)

{
  int iVar1;
  int iVar2;
  anon_union_104_1_493b367e_for_EnumDescriptorProto_3 aVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  Rep *pRVar7;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar8;
  size_t sVar9;
  ulong uVar10;
  uint index;
  int n;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *this_01;
  long lVar11;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *pRVar12;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *pRVar13;
  
  lVar11 = (long)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.value_;
  pRVar12 = this_00;
  if ((undefined1  [104])((undefined1  [104])this->field_0 & (undefined1  [104])0x1) !=
      (undefined1  [104])0x0) {
    pRVar7 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar12 = (RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)pRVar7->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar7 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)pRVar7->elements;
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (; pRVar12 !=
         (RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar12 = (RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)
                &(pRVar12->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = EnumValueDescriptorProto::ByteSizeLong
                      ((EnumValueDescriptorProto *)
                       (pRVar12->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar6 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar11 = lVar11 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  this_01 = &(this->field_0)._impl_.reserved_range_;
  pRVar13 = this_01;
  if ((*(byte *)((long)&this->field_0 + 0x20) & 1) != 0) {
    pRVar7 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
    pRVar13 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)
              pRVar7->elements;
    if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar7 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
      this_01 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)
                pRVar7->elements;
    }
  }
  lVar11 = lVar11 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  for (; pRVar13 !=
         (RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)
         (&(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar13 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)
                &(pRVar13->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = EnumDescriptorProto_EnumReservedRange::ByteSizeLong
                      ((EnumDescriptorProto_EnumReservedRange *)
                       (pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar6 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar11 = lVar11 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  uVar4 = *(uint *)((long)&this->field_0 + 0x40);
  sVar6 = lVar11 + (ulong)uVar4;
  if (0 < (int)uVar4) {
    index = 0;
    do {
      pVVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase,index);
      uVar5 = (uint)pVVar8->_M_string_length | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + pVVar8->_M_string_length + (ulong)(iVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar4 != index);
  }
  aVar3 = this->field_0;
  if (((undefined1  [104])aVar3 & (undefined1  [104])0x7) != (undefined1  [104])0x0) {
    if (((undefined1  [104])aVar3 & (undefined1  [104])0x1) != (undefined1  [104])0x0) {
      lVar11 = *(long *)(((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                        + 8);
      uVar4 = (uint)lVar11 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + lVar11 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [104])aVar3 & (undefined1  [104])0x2) != (undefined1  [104])0x0) {
      sVar9 = EnumOptions::ByteSizeLong((this->field_0)._impl_.options_);
      uVar4 = (uint)sVar9 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + sVar9 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [104])aVar3 & (undefined1  [104])0x4) != (undefined1  [104])0x0) {
      uVar10 = (long)(this->field_0)._impl_.visibility_ | 1;
      lVar11 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar11 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t EnumDescriptorProto::ByteSizeLong() const {
  const EnumDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
    {
      total_size += 1UL * this_._internal_value_size();
      for (const auto& msg : this_._internal_value()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
    {
      total_size += 1UL * this_._internal_reserved_range_size();
      for (const auto& msg : this_._internal_reserved_range()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated string reserved_name = 5;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_reserved_name().size());
      for (int i = 0, n = this_._internal_reserved_name().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_reserved_name().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional .google.protobuf.EnumOptions options = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional .google.protobuf.SymbolVisibility visibility = 6;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_visibility());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}